

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilIsop.c
# Opt level: O2

word Abc_Isop7Cover(word *pOn,word *pOnDc,word *pRes,word CostLim,int *pCover)

{
  word Cost0;
  long lVar1;
  word wVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int *pCover_00;
  int *piVar6;
  word uRes1;
  word uRes0;
  word local_80;
  ulong local_78;
  long local_70;
  word *local_68;
  ulong *local_60;
  word uRes2;
  word uOn1;
  word uOnDc2;
  word uOn2;
  word uOn0;
  
  if ((*pOn & ~*pOnDc) != 0) {
    __assert_fail("(pOn[0] & ~pOnDc[0]) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                  ,0x99,"word Abc_Isop7Cover(word *, word *, word *, word, int *)");
  }
  if ((pOn[1] & ~pOnDc[1]) != 0) {
    __assert_fail("(pOn[1] & ~pOnDc[1]) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                  ,0x9a,"word Abc_Isop7Cover(word *, word *, word *, word, int *)");
  }
  uOn0 = *pOn & ~pOnDc[1];
  uOn1 = pOn[1] & ~*pOnDc;
  Cost0 = Abc_IsopCheck(&uOn0,pOnDc,&uRes0,6,CostLim,pCover);
  if (Cost0 < CostLim) {
    local_68 = pOnDc + 1;
    local_70 = (long)Cost0 >> 0x20;
    piVar6 = pCover + local_70;
    pCover_00 = piVar6;
    if (pCover == (int *)0x0) {
      pCover_00 = (int *)0x0;
    }
    local_60 = pRes;
    local_80 = Abc_IsopCheck(&uOn1,local_68,&uRes1,6,CostLim,pCover_00);
    local_78 = local_80 + Cost0;
    if (local_78 < CostLim) {
      uOn2 = ~uRes1 & pOn[1] | ~uRes0 & *pOn;
      uOnDc2 = pOnDc[1] & *pOnDc;
      lVar1 = (long)local_80 >> 0x20;
      piVar6 = piVar6 + lVar1;
      if (pCover == (int *)0x0) {
        piVar6 = (int *)0x0;
      }
      wVar2 = Abc_IsopCheck(&uOn2,&uOnDc2,&uRes2,6,CostLim,piVar6);
      uVar3 = wVar2 + local_78;
      if (uVar3 < CostLim) {
        uVar4 = uRes0 | uRes2;
        *local_60 = uVar4;
        uVar5 = uRes2 | uRes1;
        local_60[1] = uVar5;
        if (((*pOn & ~uVar4) != 0) || ((uVar4 & ~*pOnDc) != 0)) {
          __assert_fail("(pOn[0] & ~pRes[0]) == 0 && (pRes[0] & ~pOnDc[0]) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                        ,0xaa,"word Abc_Isop7Cover(word *, word *, word *, word, int *)");
        }
        if (((pOn[1] & ~uVar5) != 0) || ((uVar5 & ~*local_68) != 0)) {
          __assert_fail("(pOn[1] & ~pRes[1]) == 0 && (pRes[1] & ~pOnDc[1]) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                        ,0xab,"word Abc_Isop7Cover(word *, word *, word *, word, int *)");
        }
        Abc_IsopAddLits(pCover,Cost0,local_80,6);
        CostLim = lVar1 + local_70 + uVar3;
      }
    }
  }
  return CostLim;
}

Assistant:

word Abc_Isop7Cover( word * pOn, word * pOnDc, word * pRes, word CostLim, int * pCover )
{
    word uOn0, uOn1, uOn2, uOnDc2, uRes0, uRes1, uRes2;
    word Cost0, Cost1, Cost2;  int nVars = 6; 
    assert( (pOn[0] & ~pOnDc[0]) == 0 );
    assert( (pOn[1] & ~pOnDc[1]) == 0 );
    // cofactor
    uOn0 = pOn[0] & ~pOnDc[1];
    uOn1 = pOn[1] & ~pOnDc[0];
    // solve for cofactors
    Cost0 = Abc_IsopCheck( &uOn0, pOnDc,   &uRes0, nVars, CostLim, pCover );
    if ( Cost0 >= CostLim ) return CostLim;
    Cost1 = Abc_IsopCheck( &uOn1, pOnDc+1, &uRes1, nVars, CostLim, pCover ? pCover + Abc_CostCubes(Cost0) : NULL );
    if ( Cost0 + Cost1 >= CostLim ) return CostLim;
    uOn2 = (pOn[0] & ~uRes0) | (pOn[1] & ~uRes1);
    uOnDc2 = pOnDc[0] & pOnDc[1];
    Cost2 = Abc_IsopCheck( &uOn2, &uOnDc2,  &uRes2, nVars, CostLim, pCover ? pCover + Abc_CostCubes(Cost0) + Abc_CostCubes(Cost1) : NULL );
    if ( Cost0 + Cost1 + Cost2 >= CostLim ) return CostLim;
    // derive the final truth table
    pRes[0] = uRes2 | uRes0;
    pRes[1] = uRes2 | uRes1;
    assert( (pOn[0] & ~pRes[0]) == 0 && (pRes[0] & ~pOnDc[0]) == 0 );
    assert( (pOn[1] & ~pRes[1]) == 0 && (pRes[1] & ~pOnDc[1]) == 0 );
    Abc_IsopAddLits( pCover, Cost0, Cost1, nVars );
    return Cost0 + Cost1 + Cost2 + Abc_CostCubes(Cost0) + Abc_CostCubes(Cost1);
}